

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O2

bool __thiscall
booster::locale::impl_icu::calendar_impl::same(calendar_impl *this,abstract_calendar *other)

{
  Calendar *pCVar1;
  char cVar2;
  long lVar3;
  bool bVar4;
  
  if (other == (abstract_calendar *)0x0) {
    bVar4 = false;
  }
  else {
    bVar4 = false;
    lVar3 = __dynamic_cast(other,&abstract_calendar::typeinfo,&typeinfo,0);
    if (lVar3 != 0) {
      pCVar1 = (this->calendar_).ptr_;
      cVar2 = (**(code **)(*(long *)pCVar1 + 0x28))(pCVar1,*(undefined8 *)(lVar3 + 0x50));
      bVar4 = cVar2 != '\0';
    }
  }
  return bVar4;
}

Assistant:

virtual bool same(abstract_calendar const *other) const 
        {
            calendar_impl const *oc=dynamic_cast<calendar_impl const *>(other);
            if(!oc)
                return false;
            return calendar_->isEquivalentTo(*oc->calendar_)!=0;
        }